

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_PROJECT_LOS_AWARE(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t typ;
  loc grid;
  _Bool _Var2;
  wchar_t dam;
  wchar_t wVar3;
  monster *pmVar4;
  wchar_t idx;
  source sVar5;
  source origin;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,context->other != L'\0')
  ;
  typ = context->subtype;
  _Var1 = context->aware;
  idx = L'\x01';
  while( true ) {
    wVar3 = cave_monster_max(cave);
    if (wVar3 <= idx) break;
    pmVar4 = cave_monster(cave,idx);
    if ((pmVar4->race != (monster_race *)0x0) && (pmVar4->midx != cave->mon_current)) {
      grid.x = (pmVar4->grid).x;
      grid.y = (pmVar4->grid).y;
      _Var2 = square_isview(cave,grid);
      if (_Var2) {
        sVar5 = source_player();
        origin._4_4_ = 0;
        origin.what = sVar5.what;
        origin.which.trap = sVar5.which.trap;
        project(origin,L'\0',grid,dam,typ,(uint)_Var1 << 8 | 0xc1,L'\0','\0',context->obj);
        context->ident = true;
      }
    }
    idx = idx + L'\x01';
  }
  return true;
}

Assistant:

bool effect_handler_PROJECT_LOS_AWARE(effect_handler_context_t *context)
{
	int i;
	int dam = effect_calculate_value(context, context->other ? true : false);
	int typ = context->subtype;

	int flg = PROJECT_JUMP | PROJECT_KILL | PROJECT_HIDE;

	if (context->aware) flg |= PROJECT_AWARE;

	/* Affect all (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		struct loc grid;

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Don't affect the caster */
		if (mon->midx == cave->mon_current) continue;

		/* Location */
		grid = mon->grid;

		/* Require line of sight */
		if (!square_isview(cave, grid)) continue;

		/* Jump directly to the target monster */
		(void)project(source_player(), 0, grid, dam, typ, flg, 0, 0, context->obj);
		context->ident = true;
	}

	/* Result */
	return true;
}